

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O1

void __thiscall UdpSocketTest::test2(UdpSocketTest *this)

{
  uint uVar1;
  int iVar2;
  Address server_addr2;
  Socket sock;
  Address sock_addr;
  Address server_addr;
  char buf [128];
  ServerSocket server2;
  Address test_addr;
  ServerSocket server;
  char local_274 [16];
  undefined4 local_264;
  Address local_250 [3];
  undefined8 local_1e0;
  undefined4 local_1d0;
  undefined8 local_1bc;
  undefined4 local_1ac;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  Address local_110 [3];
  char local_9c [16];
  undefined4 local_8c;
  Address local_78 [3];
  
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_78,false);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_110,false);
  local_1bc = 2;
  local_1ac = 0x10;
  local_274[0] = '\x02';
  local_274[1] = '\0';
  local_274[2] = '\0';
  local_274[3] = '\0';
  local_274[4] = '\0';
  local_274[5] = '\0';
  local_274[6] = '\0';
  local_274[7] = '\0';
  local_264 = 0x10;
  local_128 = 0x4141414141414141;
  uStack_120 = 0x4141414141414141;
  local_138 = 0x4141414141414141;
  uStack_130 = 0x4141414141414141;
  local_148 = 0x4141414141414141;
  uStack_140 = 0x4141414141414141;
  local_158 = 0x4141414141414141;
  uStack_150 = 0x4141414141414141;
  local_168 = 0x4141414141414141;
  uStack_160 = 0x4141414141414141;
  local_178 = 0x4141414141414141;
  uStack_170 = 0x4141414141414141;
  local_188 = 0x4141414141414141;
  uStack_180 = 0x4141414141414141;
  local_198 = 0x4141414141414141;
  uStack_190 = 0x4141414141414141;
  uVar1 = JetHead::Socket::write(local_78,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x87,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(local_78,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x8a,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::ServerSocket::bind(local_78);
  iVar2 = JetHead::ServerSocket::bind(local_110);
  if (iVar2 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x94,"Bind Failed");
  }
  local_128 = 0x4242424242424242;
  uStack_120 = 0x4242424242424242;
  local_138 = 0x4242424242424242;
  uStack_130 = 0x4242424242424242;
  local_148 = 0x4242424242424242;
  uStack_140 = 0x4242424242424242;
  local_158 = 0x4242424242424242;
  uStack_150 = 0x4242424242424242;
  local_168 = 0x4242424242424242;
  uStack_160 = 0x4242424242424242;
  local_178 = 0x4242424242424242;
  uStack_170 = 0x4242424242424242;
  local_188 = 0x4242424242424242;
  uStack_180 = 0x4242424242424242;
  local_198 = 0x4242424242424242;
  uStack_190 = 0x4242424242424242;
  uVar1 = JetHead::Socket::write(local_110,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x9c,"Writing to a socket before it has an address should be an \t\t erro: %d ",
               (ulong)uVar1);
  }
  JetHead::Socket::getLocalAddress(local_110);
  JetHead::Socket::Address::setAddress(local_274);
  local_128 = 0x4343434343434343;
  uStack_120 = 0x4343434343434343;
  local_138 = 0x4343434343434343;
  uStack_130 = 0x4343434343434343;
  local_148 = 0x4343434343434343;
  uStack_140 = 0x4343434343434343;
  local_158 = 0x4343434343434343;
  uStack_150 = 0x4343434343434343;
  local_168 = 0x4343434343434343;
  uStack_160 = 0x4343434343434343;
  local_178 = 0x4343434343434343;
  uStack_170 = 0x4343434343434343;
  local_188 = 0x4343434343434343;
  uStack_180 = 0x4343434343434343;
  local_198 = 0x4343434343434343;
  uStack_190 = 0x4343434343434343;
  uVar1 = JetHead::Socket::write(local_110,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xa7,"Writing to a non-connected socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::Socket::Socket((Socket *)local_250,false);
  local_1e0 = 2;
  local_1d0 = 0x10;
  local_198 = 0x4444444444444444;
  uStack_190 = 0x4444444444444444;
  local_188 = 0x4444444444444444;
  uStack_180 = 0x4444444444444444;
  local_178 = 0x4444444444444444;
  uStack_170 = 0x4444444444444444;
  local_168 = 0x4444444444444444;
  uStack_160 = 0x4444444444444444;
  local_158 = 0x4444444444444444;
  uStack_150 = 0x4444444444444444;
  local_148 = 0x4444444444444444;
  uStack_140 = 0x4444444444444444;
  local_138 = 0x4444444444444444;
  uStack_130 = 0x4444444444444444;
  local_128 = 0x4444444444444444;
  uStack_120 = 0x4444444444444444;
  uVar1 = JetHead::Socket::write(local_250,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb4,"Writing to an unconnected socket should be an error: %d.",(ulong)uVar1);
  }
  local_9c[0] = '\x02';
  local_9c[1] = '\0';
  local_9c[2] = '\x17';
  local_9c[3] = 'q';
  JetHead::Socket::Address::setAddress(local_9c);
  local_8c = 0x10;
  uVar1 = JetHead::Socket::connect(local_250);
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xb9,"Connect failed %d.",(ulong)uVar1);
  }
  JetHead::Socket::getLocalAddress(local_250);
  uVar1 = JetHead::Socket::write(local_250,(int)&local_198);
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xc0,"Write failed %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::read(local_250,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,199,"reading from a socket that is connected to nothing should fail %d.",
               (ulong)uVar1);
  }
  uVar1 = JetHead::Socket::close();
  if ((int)uVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcb,"Close failed: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(local_250,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xcf,"Writing to a closed socket should be an error: %d.",(ulong)uVar1);
  }
  uVar1 = JetHead::Socket::write(local_250,(int)&local_198);
  if (uVar1 != 0xffffffff) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0xd3,"Writing to a closed socket should be an error: %d.",(ulong)uVar1);
  }
  JetHead::Socket::~Socket((Socket *)local_250);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_110);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_78);
  return;
}

Assistant:

void UdpSocketTest::test2()
{
 
  ServerSocket server(false), server2(false);
  Socket::Address server_addr, server_addr2;
  int res;

  char buf[128];
  for (int i = 0; i < 128; i++)
    buf[i] = 'A';

  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);
  res = server.write(buf, 128);
  if( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  // This fails...
  res = server.bind(server_addr);
  //if ( res < 0 )
  //TestFailed( "Bind Failed" );


   res = server2.bind(server_addr2);
   if ( res < 0 )
     TestFailed( "Bind Failed" );

   for (int i = 0; i < 128; i++)
     buf[i] = 'B';

   res = server2.write(buf, 128);
   if( res != -1 )
     TestFailed("Writing to a socket before it has an address should be an \
		 erro: %d ", res);

  server2.getLocalAddress( server_addr2 );  
  server_addr2.setAddress( "127.0.0.1" );
  //cerr << "Server name " << server_addr2.getName() << " " << server_addr2.getPort()  << endl;

  for (int i = 0; i < 128; i++)
    buf[i] = 'C';

  res = server2.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a non-connected socket should be an error: %d.", res);



  // Create a socket: write before being connected, connect, write, read.
  Socket sock(false);
  Socket::Address sock_addr;
  for (int i = 0; i < 128; i++)
    buf[i] = 'D';


  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to an unconnected socket should be an error: %d.", res);

  Socket::Address test_addr("127.0.0.1", 6001);
  res = sock.connect(test_addr);
  if( res < 0 )
    TestFailed("Connect failed %d.", res);

  sock.getLocalAddress( sock_addr );
  //cerr << "Sock name " << sock_addr.getName() << " " << sock_addr.getPort()  << endl;
  
  res = sock.write(buf, 128);
  if( res < 0 )
    TestFailed("Write failed %d.", res);


  // This will fail unless there is an other socket connected to this one
  // nc -u -p 6001 127.0.0.1 <sock_addr.getPort()>
  res = sock.read(buf, 128);
  if( res != -1)
    TestFailed("reading from a socket that is connected to nothing should fail %d.", res);

  res = sock.close();
  if( res < 0 )
    TestFailed("Close failed: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
  
  res = sock.write(buf, 128);
  if ( res != -1 )
    TestFailed("Writing to a closed socket should be an error: %d.", res);
 
}